

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types_wrapper.h
# Opt level: O2

void __thiscall Am_Image_Array_Data::Am_Image_Array_Data(Am_Image_Array_Data *this)

{
  (this->super_Am_Wrapper).refs = 1;
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002eb578;
  this->x_hot = -1;
  this->y_hot = -1;
  this->num_colors = 0;
  this->image_ = (Am_Generic_Image *)0x0;
  this->main_inverted_mask = 0;
  this->main_bitmap = 0;
  this->main_mask = 0;
  this->colors = (XColor *)0x0;
  this->name = (char *)0x0;
  this->main_display = (Display *)0x0;
  this->head = (Bitmap_Item *)0x0;
  this->next = list;
  list = this;
  return;
}

Assistant:

Am_Wrapper(const Am_Wrapper &) : refs(1) { ; }